

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::EnumFieldGenerator::GenerateCFunctionDeclarations
          (EnumFieldGenerator *this,Printer *printer)

{
  if (*(int *)(*(long *)((this->super_SingleFieldGenerator).super_FieldGenerator.descriptor_ + 0x30)
              + 0x8c) == 3) {
    io::Printer::Print(printer,&(this->super_SingleFieldGenerator).super_FieldGenerator.variables_,
                       "/**\n * Fetches the raw value of a @c $owning_message_class$\'s @c $name$ property, even\n * if the value was not defined by the enum at the time the code was generated.\n **/\nint32_t $owning_message_class$_$capitalized_name$_RawValue($owning_message_class$ *message);\n/**\n * Sets the raw value of an @c $owning_message_class$\'s @c $name$ property, allowing\n * it to be set to a value that was not defined by the enum at the time the code\n * was generated.\n **/\nvoid Set$owning_message_class$_$capitalized_name$_RawValue($owning_message_class$ *message, int32_t value);\n\n"
                      );
    return;
  }
  return;
}

Assistant:

void EnumFieldGenerator::GenerateCFunctionDeclarations(
    io::Printer* printer) const {
  if (!HasPreservingUnknownEnumSemantics(descriptor_->file())) {
    return;
  }

  printer->Print(
      variables_,
      "/**\n"
      " * Fetches the raw value of a @c $owning_message_class$'s @c $name$ property, even\n"
      " * if the value was not defined by the enum at the time the code was generated.\n"
      " **/\n"
      "int32_t $owning_message_class$_$capitalized_name$_RawValue($owning_message_class$ *message);\n"
      "/**\n"
      " * Sets the raw value of an @c $owning_message_class$'s @c $name$ property, allowing\n"
      " * it to be set to a value that was not defined by the enum at the time the code\n"
      " * was generated.\n"
      " **/\n"
      "void Set$owning_message_class$_$capitalized_name$_RawValue($owning_message_class$ *message, int32_t value);\n"
      "\n");
}